

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 __thiscall djb::tab::u2_to_h2_std(tab *this,vec2 *u,vec3 *wi)

{
  float_t qf1;
  float_t fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3 vVar6;
  vec3 local_28;
  
  local_28.z = wi->z;
  local_28.x = wi->x;
  local_28.y = wi->y;
  qf1 = tab::qf1(this,u->x,&local_28);
  fVar1 = qf2(this,u->y,qf1,&local_28);
  fVar5 = (qf1 + qf1 + -1.0) * 3.1415927;
  fVar2 = fVar1 * fVar1 * 3.1415927 * 0.5;
  fVar3 = sinf(fVar2);
  fVar4 = cosf(fVar5);
  fVar5 = sinf(fVar5);
  fVar2 = cosf(fVar2);
  vVar6.y = fVar5 * fVar3;
  vVar6.x = fVar4 * fVar3;
  vVar6.z = fVar2;
  return vVar6;
}

Assistant:

vec3 tab::u2_to_h2_std(const vec2 &u, const vec3 &wi) const
{
	int s = 1;//wi.y > 0 ? 1 : -1; // exploit the azimuthal symmetry of the BRDF
	vec3 wi_std = vec3(s * wi.x, s * wi.y, wi.z);
	float_t u1 = qf1(u.x, wi_std);
	float_t u2 = qf2(u.y, u1, wi_std);
	float_t pm = (2 * u1 - 1) * m_pi();
	float_t tm = sqr(u2) * m_pi() / 2;
	float_t z_m = sin(tm);

	return vec3(s * z_m * cos(pm), s * z_m * sin(pm), cos(tm));
}